

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

int Curl_pgrsUpdate(Curl_easy *data)

{
  long lVar1;
  FILE *whereto;
  _Bool _Var2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  curl_off_t seconds;
  ulong bytes;
  curltime now;
  long local_c8;
  char local_b6 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  pgrs_estimate ul_estm;
  pgrs_estimate dl_estm;
  
  now = Curl_now();
  _Var2 = progress_calc(data,now);
  if (((data->progress).flags & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
    if ((data->set).fprogress == (curl_progress_callback)0x0) {
      if (!_Var2) {
        return 0;
      }
      goto LAB_0014a4dd;
    }
    Curl_set_in_callback(data,true);
    iVar3 = (*(data->set).fprogress)
                      ((data->set).progress_client,(double)(data->progress).dl.total_size,
                       (double)(data->progress).dl.cur_size,(double)(data->progress).ul.total_size,
                       (double)(data->progress).ul.cur_size);
  }
  else {
    Curl_set_in_callback(data,true);
    iVar3 = (*(data->set).fxferinfo)
                      ((data->set).progress_client,(data->progress).dl.total_size,
                       (data->progress).dl.cur_size,(data->progress).ul.total_size,
                       (data->progress).ul.cur_size);
  }
  Curl_set_in_callback(data,false);
  if ((iVar3 != 0) && (iVar3 != 0x10000001)) {
    Curl_failf(data,"Callback aborted");
  }
  iVar5 = 0;
  if (iVar3 != 0x10000001) {
    iVar5 = iVar3;
  }
  if (iVar3 != 0x10000001 || !_Var2) {
    return iVar5;
  }
LAB_0014a4dd:
  lVar4 = (data->progress).timespent / 1000000;
  uVar6 = (data->progress).flags;
  if (-1 < (char)uVar6) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar6 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar6;
  }
  pgrs_estimates(&(data->progress).ul,SUB41((uVar6 & 0x20) >> 5,0),&ul_estm);
  pgrs_estimates(&(data->progress).dl,SUB41((uVar6 & 0x40) >> 6,0),&dl_estm);
  if (dl_estm.secs < ul_estm.secs) {
    dl_estm.secs = ul_estm.secs;
  }
  seconds = 0;
  if (0 < dl_estm.secs) {
    seconds = dl_estm.secs - lVar4;
  }
  time2str(time_left,seconds);
  time2str(time_total,dl_estm.secs);
  time2str(local_b6,lVar4);
  uVar6 = (data->progress).flags;
  lVar4 = (&(data->progress).ul.total_size)[(uVar6 & 0x20) == 0];
  lVar1 = (&(data->progress).dl.total_size)[(uVar6 & 0x40) == 0];
  bytes = lVar4 + lVar1;
  if (0x7fffffffffffffff - lVar4 < lVar1) {
    bytes = 0x7fffffffffffffff;
  }
  local_c8 = (data->progress).ul.cur_size + (data->progress).dl.cur_size;
  if ((long)bytes < 0x2711) {
    if ((long)bytes < 1) {
      local_c8 = 0;
    }
    else {
      local_c8 = (local_c8 * 100) / (long)bytes;
    }
  }
  else {
    local_c8 = local_c8 / (long)(bytes / 100);
  }
  whereto = (data->set).err;
  max5data(bytes,max5[2]);
  max5data((data->progress).dl.cur_size,max5[0]);
  max5data((data->progress).ul.cur_size,max5[1]);
  max5data((data->progress).dl.speed,max5[3]);
  max5data((data->progress).ul.speed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",local_c8,max5 + 2,
                dl_estm.percent,max5,ul_estm.percent,max5 + 1,max5 + 3,max5 + 4,time_total,local_b6,
                time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  return pgrsupdate(data, showprogress);
}